

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zreadhb.c
# Opt level: O3

void zreadhb(FILE *fp,int *nrow,int *ncol,int_t *nonz,doublecomplex **nzval,int_t **rowind,
            int_t **colptr)

{
  int_t *__s;
  int_t *addr;
  long lVar1;
  ulong uVar2;
  int_t *piVar3;
  doublecomplex *pdVar4;
  ulong uVar5;
  long lVar6;
  doublecomplex *pdVar7;
  int iVar8;
  ulong uVar9;
  double *pdVar10;
  int_t *piVar11;
  int iVar12;
  int *addr_00;
  int iVar13;
  int iVar14;
  uint uVar15;
  double dVar16;
  int tmp;
  int valsize;
  int valnum;
  int rowsize;
  int rownum;
  int colsize;
  int colnum;
  char type [4];
  char buf [100];
  char msg [256];
  int local_234;
  doublecomplex **local_230;
  int_t **local_228;
  void *local_220;
  doublecomplex *local_218;
  int_t *local_210;
  int_t *local_208;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  undefined1 local_1e4;
  byte local_1e3;
  undefined1 local_1e1;
  int_t *local_1e0;
  int_t *local_1d8;
  long local_1d0;
  int_t *local_1c8;
  FILE *local_1c0;
  int *local_1b8;
  int_t *local_1b0;
  char local_1a8 [14];
  undefined1 local_19a;
  char local_138 [264];
  
  local_230 = nzval;
  local_228 = rowind;
  local_1e0 = nonz;
  fgets(local_1a8,100,(FILE *)fp);
  fputs(local_1a8,_stdout);
  iVar12 = 5;
  iVar13 = 0;
  iVar8 = 0;
  do {
    __isoc99_fscanf(fp,"%14c",local_1a8);
    local_19a = 0;
    __isoc99_sscanf(local_1a8,"%d",&local_234);
    if (iVar12 == 2) {
      iVar8 = local_234;
    }
    iVar14 = local_234;
    if (local_234 == 0) {
      iVar14 = iVar13;
    }
    if (iVar12 != 1) {
      iVar14 = iVar13;
    }
    iVar13 = iVar14;
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  do {
    iVar12 = fgetc((FILE *)fp);
  } while (iVar12 != 10);
  __isoc99_fscanf(fp,"%3c",&local_1e4);
  __isoc99_fscanf(fp,"%11c",local_1a8);
  local_1e1 = 0;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  iVar12 = atoi(local_1a8);
  *nrow = iVar12;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  iVar12 = atoi(local_1a8);
  *ncol = iVar12;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  iVar12 = atoi(local_1a8);
  piVar3 = local_1e0;
  *local_1e0 = iVar12;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  local_234 = atoi(local_1a8);
  if (local_234 != 0) {
    puts("This is not an assembled matrix!");
  }
  if (*nrow != *ncol) {
    puts("Matrix is not square.");
  }
  do {
    iVar12 = fgetc((FILE *)fp);
  } while (iVar12 != 10);
  zallocateA(*ncol,*piVar3,local_230,local_228,colptr);
  __isoc99_fscanf(fp,"%16c",local_1a8);
  zParseIntFormat(local_1a8,&local_1e8,&local_1ec);
  __isoc99_fscanf(fp,"%16c",local_1a8);
  zParseIntFormat(local_1a8,&local_1f0,&local_1f4);
  __isoc99_fscanf(fp,"%20c",local_1a8);
  zParseFloatFormat(local_1a8,&local_1f8,&local_1fc);
  __isoc99_fscanf(fp,"%20c",local_1a8);
  do {
    iVar12 = fgetc((FILE *)fp);
  } while (iVar12 != 10);
  if (iVar13 != 0) {
    do {
      iVar12 = fgetc((FILE *)fp);
    } while (iVar12 != 10);
  }
  ReadVector(fp,*ncol + 1,*colptr,local_1e8,local_1ec);
  ReadVector(fp,*piVar3,*local_228,local_1f0,local_1f4);
  if (iVar8 != 0) {
    zReadValues(fp,*piVar3,*local_230,local_1f8,local_1fc);
  }
  if ((local_1e3 & 0xdf) == 0x53) {
    uVar15 = *ncol;
    uVar5 = (ulong)uVar15;
    piVar11 = *local_228;
    addr_00 = *colptr;
    local_218 = *local_230;
    iVar8 = uVar15 + 1;
    __s = intMalloc(iVar8);
    if (__s == (int_t *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0xd5,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
      superlu_abort_and_exit(local_138);
    }
    addr = intMalloc(iVar8);
    if (addr == (int_t *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xd7,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
      superlu_abort_and_exit(local_138);
    }
    local_208 = intMalloc(*piVar3);
    if (local_208 == (int_t *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",0xd9,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
      superlu_abort_and_exit(local_138);
    }
    local_220 = superlu_malloc((long)*piVar3 << 4);
    if (local_220 == (void *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_val[]",0xdb,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
      superlu_abort_and_exit(local_138);
    }
    if ((int)uVar15 < 1) {
      *addr = 0;
    }
    else {
      uVar9 = 0;
      memset(__s,0,uVar5 * 4);
      iVar12 = *addr_00;
      do {
        lVar1 = uVar9 + 1;
        uVar9 = uVar9 + 1;
        iVar13 = addr_00[lVar1];
        if (iVar12 < addr_00[lVar1]) {
          lVar1 = (long)iVar12;
          do {
            __s[piVar11[lVar1]] = __s[piVar11[lVar1]] + 1;
            lVar1 = lVar1 + 1;
            iVar13 = addr_00[uVar9];
          } while (lVar1 < addr_00[uVar9]);
        }
        iVar12 = iVar13;
      } while (uVar9 != uVar5);
      *addr = 0;
      uVar9 = 0;
      do {
        addr[uVar9 + 1] = __s[uVar9] + addr[uVar9];
        __s[uVar9] = addr[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar5 != uVar9);
      iVar12 = *addr_00;
      uVar9 = 0;
      do {
        uVar2 = uVar9 + 1;
        iVar13 = addr_00[uVar9 + 1];
        if (iVar12 < addr_00[uVar9 + 1]) {
          lVar1 = (long)iVar12;
          pdVar4 = local_218 + lVar1;
          do {
            iVar12 = piVar11[lVar1];
            local_208[__s[iVar12]] = (int_t)uVar9;
            dVar16 = pdVar4->i;
            pdVar10 = (double *)((long)local_220 + (long)__s[iVar12] * 0x10);
            *pdVar10 = pdVar4->r;
            pdVar10[1] = dVar16;
            __s[iVar12] = __s[iVar12] + 1;
            lVar1 = lVar1 + 1;
            pdVar4 = pdVar4 + 1;
            iVar13 = addr_00[uVar2];
          } while (lVar1 < addr_00[uVar2]);
        }
        iVar12 = iVar13;
        uVar9 = uVar2;
      } while (uVar2 != uVar5);
    }
    lVar1 = (long)*piVar3 * 2 - (long)(int)uVar15;
    local_210 = intMalloc(iVar8);
    if (local_210 == (int_t *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC a_colptr[]",0xf4,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
      superlu_abort_and_exit(local_138);
    }
    local_1d8 = piVar11;
    local_1c8 = __s;
    local_1c0 = (FILE *)fp;
    piVar3 = intMalloc((int_t)lVar1);
    if (piVar3 == (int_t *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_rowind[]",0xf6,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
      superlu_abort_and_exit(local_138);
    }
    local_1d0 = lVar1;
    pdVar4 = (doublecomplex *)superlu_malloc(lVar1 * 0x10);
    if (pdVar4 == (doublecomplex *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_val[]",0xf8,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
      superlu_abort_and_exit(local_138);
    }
    *local_210 = 0;
    piVar11 = local_208;
    if (0 < (int)uVar15) {
      uVar15 = 0;
      uVar9 = 0;
      local_1b8 = addr_00;
      local_1b0 = piVar3;
      do {
        lVar1 = (long)addr[uVar9];
        uVar2 = uVar9 + 1;
        iVar8 = addr[uVar9 + 1];
        if (addr[uVar9] < iVar8) {
          pdVar10 = (double *)(lVar1 * 0x10 + (long)local_220);
          do {
            if (uVar9 != (uint)piVar11[lVar1]) {
              piVar3[(int)uVar15] = piVar11[lVar1];
              pdVar7 = pdVar4 + (int)uVar15;
              dVar16 = pdVar10[1];
              pdVar4[(int)uVar15].r = *pdVar10;
              pdVar4[(int)uVar15].i = dVar16;
              dVar16 = z_abs1(pdVar7);
              if (dVar16 < 4.047e-300) {
                printf("%5d: %e\t%e\n",pdVar7->r,pdVar7->i,(ulong)uVar15);
              }
              uVar15 = uVar15 + 1;
              iVar8 = addr[uVar2];
              piVar11 = local_208;
              piVar3 = local_1b0;
            }
            lVar1 = lVar1 + 1;
            pdVar10 = pdVar10 + 2;
          } while (lVar1 < iVar8);
        }
        lVar1 = (long)local_1b8[uVar9];
        if (local_1b8[uVar9] < local_1b8[uVar2]) {
          lVar6 = (long)(int)uVar15 << 2;
          pdVar7 = local_218 + lVar1;
          do {
            *(int_t *)((long)piVar3 + lVar6) = local_1d8[lVar1];
            dVar16 = pdVar7->i;
            pdVar10 = (double *)((long)&pdVar4->r + lVar6 * 4);
            *pdVar10 = pdVar7->r;
            pdVar10[1] = dVar16;
            lVar1 = lVar1 + 1;
            uVar15 = uVar15 + 1;
            lVar6 = lVar6 + 4;
            pdVar7 = pdVar7 + 1;
          } while (lVar1 < local_1b8[uVar2]);
        }
        local_210[uVar2] = uVar15;
        uVar9 = uVar2;
        addr_00 = local_1b8;
      } while (uVar2 != uVar5);
    }
    lVar1 = local_1d0;
    printf("FormFullA: new_nnz = %lld\n",local_1d0);
    superlu_free(local_218);
    superlu_free(local_1d8);
    superlu_free(addr_00);
    superlu_free(local_1c8);
    superlu_free(local_220);
    superlu_free(piVar11);
    superlu_free(addr);
    *local_230 = pdVar4;
    *local_228 = piVar3;
    *colptr = local_210;
    *local_1e0 = (int_t)lVar1;
    fp = (FILE *)local_1c0;
  }
  fclose((FILE *)fp);
  return;
}

Assistant:

void
zreadhb(FILE *fp, int *nrow, int *ncol, int_t *nonz,
	doublecomplex **nzval, int_t **rowind, int_t **colptr)
{

    register int i, numer_lines = 0, rhscrd = 0;
    int tmp, colnum, colsize, rownum, rowsize, valnum, valsize;
    char buf[100], type[4];
    int sym;

    /* Line 1 */
    fgets(buf, 100, fp);
    fputs(buf, stdout);

    /* Line 2 */
    for (i=0; i<5; i++) {
	fscanf(fp, "%14c", buf); buf[14] = 0;
	sscanf(buf, "%d", &tmp);
	if (i == 3) numer_lines = tmp;
	if (i == 4 && tmp) rhscrd = tmp;
    }
    zDumpLine(fp);

    /* Line 3 */
    fscanf(fp, "%3c", type);
    fscanf(fp, "%11c", buf); /* pad */
    type[3] = 0;
#if ( DEBUGlevel>=1 )
    printf("Matrix type %s\n", type);
#endif
    
    fscanf(fp, "%14c", buf); *nrow = atoi(buf);
    fscanf(fp, "%14c", buf); *ncol = atoi(buf);
    fscanf(fp, "%14c", buf); *nonz = atoi(buf);
    fscanf(fp, "%14c", buf); tmp = atoi(buf);
    
    if (tmp != 0)
	  printf("This is not an assembled matrix!\n");
    if (*nrow != *ncol)
	printf("Matrix is not square.\n");
    zDumpLine(fp);

    /* Allocate storage for the three arrays ( nzval, rowind, colptr ) */
    zallocateA(*ncol, *nonz, nzval, rowind, colptr);

    /* Line 4: format statement */
    fscanf(fp, "%16c", buf);
    zParseIntFormat(buf, &colnum, &colsize);
    fscanf(fp, "%16c", buf);
    zParseIntFormat(buf, &rownum, &rowsize);
    fscanf(fp, "%20c", buf);
    zParseFloatFormat(buf, &valnum, &valsize);
    fscanf(fp, "%20c", buf);
    zDumpLine(fp);

    /* Line 5: right-hand side */    
    if ( rhscrd ) zDumpLine(fp); /* skip RHSFMT */
    
#ifdef DEBUG
    printf("%d rows, %lld nonzeros\n", *nrow, (long long) *nonz);
    printf("colnum %d, colsize %d\n", colnum, colsize);
    printf("rownum %d, rowsize %d\n", rownum, rowsize);
    printf("valnum %d, valsize %d\n", valnum, valsize);
#endif
    
    ReadVector(fp, *ncol+1, *colptr, colnum, colsize);
    ReadVector(fp, *nonz, *rowind, rownum, rowsize);
    if ( numer_lines ) {
        zReadValues(fp, *nonz, *nzval, valnum, valsize);
    }
    
    sym = (type[1] == 'S' || type[1] == 's');
    if ( sym ) {
	FormFullA(*ncol, nonz, nzval, rowind, colptr);
    }

    fclose(fp);
}